

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtectorChain.cpp
# Opt level: O2

bool __thiscall
CppUnit::ProtectorChain::protect(ProtectorChain *this,Functor *functor,ProtectorContext *context)

{
  Protector *pPVar1;
  int iVar2;
  size_type sVar3;
  _Elt_pointer ppFVar4;
  Functor *pFVar5;
  reference ppPVar6;
  reference ppFVar7;
  ulong uVar8;
  uint uVar9;
  Functor *pFVar10;
  Functor *local_88;
  Functors functors;
  
  if ((this->m_protectors).
      super__Deque_base<CppUnit::Protector_*,_std::allocator<CppUnit::Protector_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur !=
      (this->m_protectors).
      super__Deque_base<CppUnit::Protector_*,_std::allocator<CppUnit::Protector_*>_>._M_impl.
      super__Deque_impl_data._M_start._M_cur) {
    std::_Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>::_Deque_base
              (&functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>)
    ;
    sVar3 = std::deque<CppUnit::Protector_*,_std::allocator<CppUnit::Protector_*>_>::size
                      (&this->m_protectors);
    uVar8 = sVar3 & 0xffffffff;
    while( true ) {
      uVar8 = uVar8 - 1;
      if ((int)(uint)uVar8 < 0) break;
      pFVar10 = functor;
      if (functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_cur !=
          functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>.
          _M_impl.super__Deque_impl_data._M_start._M_cur) {
        ppFVar4 = functors.
                  super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>._M_impl
                  .super__Deque_impl_data._M_finish._M_cur;
        if (functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur ==
            functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppFVar4 = functors.
                    super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        pFVar10 = ppFVar4[-1];
      }
      pFVar5 = (Functor *)operator_new(0x20);
      ppPVar6 = std::
                _Deque_iterator<CppUnit::Protector_*,_CppUnit::Protector_*&,_CppUnit::Protector_**>
                ::operator[](&(this->m_protectors).
                              super__Deque_base<CppUnit::Protector_*,_std::allocator<CppUnit::Protector_*>_>
                              ._M_impl.super__Deque_impl_data._M_start,
                             (ulong)((uint)uVar8 & 0x7fffffff));
      pPVar1 = *ppPVar6;
      pFVar5->_vptr_Functor = (_func_int **)&PTR__Functor_0014ca40;
      pFVar5[1]._vptr_Functor = (_func_int **)pPVar1;
      pFVar5[2]._vptr_Functor = (_func_int **)pFVar10;
      pFVar5[3]._vptr_Functor = (_func_int **)context;
      local_88 = pFVar5;
      std::deque<CppUnit::Functor*,std::allocator<CppUnit::Functor*>>::
      emplace_back<CppUnit::Functor*>
                ((deque<CppUnit::Functor*,std::allocator<CppUnit::Functor*>> *)&functors,&local_88);
    }
    if (functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur ==
        functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur =
           functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    iVar2 = (*functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur[-1]->_vptr_Functor[2])();
    uVar9 = 0;
    while( true ) {
      sVar3 = std::deque<CppUnit::Protector_*,_std::allocator<CppUnit::Protector_*>_>::size
                        (&this->m_protectors);
      if (sVar3 <= uVar9) break;
      ppFVar7 = std::_Deque_iterator<CppUnit::Functor_*,_CppUnit::Functor_*&,_CppUnit::Functor_**>::
                operator[](&functors.
                            super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>
                            ._M_impl.super__Deque_impl_data._M_start,(ulong)uVar9);
      if (*ppFVar7 != (Functor *)0x0) {
        (*(*ppFVar7)->_vptr_Functor[1])();
      }
      uVar9 = uVar9 + 1;
    }
    std::_Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>::~_Deque_base
              (&functors.super__Deque_base<CppUnit::Functor_*,_std::allocator<CppUnit::Functor_*>_>)
    ;
    return SUB41(iVar2,0);
  }
  iVar2 = (*functor->_vptr_Functor[2])(functor);
  return SUB41(iVar2,0);
}

Assistant:

bool 
ProtectorChain::protect( const Functor &functor,
                         const ProtectorContext &context )
{
  if ( m_protectors.empty() )
    return functor();

  Functors functors;
  for ( int index = m_protectors.size()-1; index >= 0; --index )
  {
    const Functor &protectedFunctor = 
              functors.empty() ? functor : *functors.back();

    functors.push_back( new ProtectFunctor( m_protectors[index],
                                            protectedFunctor, 
                                            context ) );
  }

  const Functor &outermostFunctor = *functors.back();
  bool succeed = outermostFunctor();

  for ( unsigned int deletingIndex = 0; deletingIndex < m_protectors.size(); ++deletingIndex )
    delete functors[deletingIndex];

  return succeed;
}